

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

Abc_Ntk_t * Abc_SclPerformBuffering(Abc_Ntk_t *p,int DegreeR,int Degree,int fUseInvs,int fVerbose)

{
  int iVar1;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *p_01;
  int Fill;
  int iVar3;
  
  if (p->ntkFunc == ABC_FUNC_MAP) {
    if (fUseInvs != 0) {
      puts("Warning!!! Using inverters instead of buffers.");
      if (p->vPhases == (Vec_Int_t *)0x0) {
        puts("The phases are not given. The result will not verify.");
      }
    }
    p_00 = Vec_IntAlloc(p->vCis->nSize);
    for (iVar3 = 0; iVar3 < p->vCis->nSize; iVar3 = iVar3 + 1) {
      pAVar2 = Abc_NtkCi(p,iVar3);
      Vec_IntPush(p_00,*(uint *)&pAVar2->field_0x14 >> 0xc);
    }
    Abc_NtkIncrementTravId(p);
    for (iVar3 = 0; iVar1 = p->vCis->nSize, iVar3 < iVar1; iVar3 = iVar3 + 1) {
      pAVar2 = Abc_NtkCi(p,iVar3);
      Abc_SclPerformBuffering_rec(pAVar2,DegreeR,Degree,fUseInvs,fVerbose);
    }
    for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
      pAVar2 = Abc_NtkCi(p,iVar3);
      iVar1 = Vec_IntEntry(p_00,iVar3);
      *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xfff | iVar1 << 0xc;
      iVar1 = p->vCis->nSize;
    }
    for (iVar3 = 0; iVar3 < p->vObjs->nSize; iVar3 = iVar3 + 1) {
      pAVar2 = Abc_NtkObj(p,iVar3);
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        Abc_ObjLevelNew(pAVar2);
      }
    }
    Vec_IntFree(p_00);
    if (p->vPhases != (Vec_Int_t *)0x0) {
      Vec_IntFillExtra(p->vPhases,p->vObjs->nSize,Fill);
    }
    p_01 = Abc_NtkDupDfs(p);
    Abc_SclCheckNtk(p_01,fVerbose);
    return p_01;
  }
  __assert_fail("Abc_NtkHasMapping(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                ,0x1d1,"Abc_Ntk_t *Abc_SclPerformBuffering(Abc_Ntk_t *, int, int, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_SclPerformBuffering( Abc_Ntk_t * p, int DegreeR, int Degree, int fUseInvs, int fVerbose )
{
    Vec_Int_t * vCiLevs;
    Abc_Ntk_t * pNew;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkHasMapping(p) );
    if ( fUseInvs )
    {
        printf( "Warning!!! Using inverters instead of buffers.\n" );
        if ( p->vPhases == NULL )
            printf( "The phases are not given. The result will not verify.\n" );
    }
    // remember CI levels
    vCiLevs = Vec_IntAlloc( Abc_NtkCiNum(p) );
    Abc_NtkForEachCi( p, pObj, i )
        Vec_IntPush( vCiLevs, Abc_ObjLevel(pObj) );
    // perform buffering
    Abc_NtkIncrementTravId( p );        
    Abc_NtkForEachCi( p, pObj, i )
        Abc_SclPerformBuffering_rec( pObj, DegreeR, Degree, fUseInvs, fVerbose );
    // recompute logic levels
    Abc_NtkForEachCi( p, pObj, i )
        pObj->Level = Vec_IntEntry( vCiLevs, i );
    Abc_NtkForEachNode( p, pObj, i )
        Abc_ObjLevelNew( pObj );
    Vec_IntFree( vCiLevs );
    // if phases are present
    if ( p->vPhases )
        Vec_IntFillExtra( p->vPhases, Abc_NtkObjNumMax(p), 0 );
    // duplication in topo order
    pNew = Abc_NtkDupDfs( p );
    Abc_SclCheckNtk( pNew, fVerbose );
//    Abc_NtkDelete( pNew );
    return pNew;
}